

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrBodyJointFB value)

{
  pointer pbVar1;
  string *psVar2;
  string *command_name_00;
  int iVar3;
  pointer pbVar4;
  bool bVar5;
  string vuid;
  string error_str;
  string local_a8;
  string *local_88;
  string *local_80;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_78;
  string *local_70;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_68;
  string local_50;
  
  if (instance_info != (GenValidUsageXrInstanceInfo *)0x0) {
    pbVar4 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = pbVar4 != pbVar1;
    local_88 = item_name;
    local_80 = command_name;
    local_78 = objects_info;
    local_70 = validation_name;
    if (bVar5) {
      iVar3 = std::__cxx11::string::compare((char *)pbVar4);
      while (iVar3 != 0) {
        pbVar4 = pbVar4 + 1;
        bVar5 = pbVar4 != pbVar1;
        if (pbVar4 == pbVar1) break;
        iVar3 = std::__cxx11::string::compare((char *)pbVar4);
      }
    }
    command_name_00 = local_80;
    psVar2 = local_88;
    if (!bVar5) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"VUID-","");
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(local_70->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_a8);
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(psVar2->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_a8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"XrBodyJointFB requires extension ","");
      std::__cxx11::string::append((char *)&local_50);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_68,local_78);
      CoreValidLogMessage(instance_info,&local_a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name_00,
                          &local_68,&local_50);
      if (local_68.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
        return false;
      }
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      return false;
    }
  }
  if (0x47 < (uint)(value + XR_BODY_JOINT_HIPS_FB)) {
    return false;
  }
  return true;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrBodyJointFB value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_FB_body_tracking, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_FB_body_tracking")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrBodyJointFB requires extension ";
        error_str += " \"XR_FB_body_tracking\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_BODY_JOINT_ROOT_FB:
            return true;
        case XR_BODY_JOINT_HIPS_FB:
            return true;
        case XR_BODY_JOINT_SPINE_LOWER_FB:
            return true;
        case XR_BODY_JOINT_SPINE_MIDDLE_FB:
            return true;
        case XR_BODY_JOINT_SPINE_UPPER_FB:
            return true;
        case XR_BODY_JOINT_CHEST_FB:
            return true;
        case XR_BODY_JOINT_NECK_FB:
            return true;
        case XR_BODY_JOINT_HEAD_FB:
            return true;
        case XR_BODY_JOINT_LEFT_SHOULDER_FB:
            return true;
        case XR_BODY_JOINT_LEFT_SCAPULA_FB:
            return true;
        case XR_BODY_JOINT_LEFT_ARM_UPPER_FB:
            return true;
        case XR_BODY_JOINT_LEFT_ARM_LOWER_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_WRIST_TWIST_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_SHOULDER_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_SCAPULA_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_ARM_UPPER_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_ARM_LOWER_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_WRIST_TWIST_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_PALM_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_WRIST_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_THUMB_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_THUMB_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_THUMB_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_THUMB_TIP_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_INDEX_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_INDEX_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_INDEX_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_INDEX_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_INDEX_TIP_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_MIDDLE_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_MIDDLE_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_MIDDLE_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_MIDDLE_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_MIDDLE_TIP_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_RING_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_RING_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_RING_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_RING_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_RING_TIP_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_LITTLE_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_LITTLE_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_LITTLE_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_LITTLE_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_LITTLE_TIP_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_PALM_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_WRIST_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_THUMB_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_THUMB_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_THUMB_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_THUMB_TIP_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_INDEX_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_INDEX_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_INDEX_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_INDEX_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_INDEX_TIP_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_MIDDLE_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_MIDDLE_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_MIDDLE_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_MIDDLE_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_MIDDLE_TIP_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_RING_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_RING_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_RING_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_RING_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_RING_TIP_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_LITTLE_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_LITTLE_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_LITTLE_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_LITTLE_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_LITTLE_TIP_FB:
            return true;
        case XR_BODY_JOINT_COUNT_FB:
            return true;
        case XR_BODY_JOINT_NONE_FB:
            return true;
    default:
        return false;
}
}